

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O2

int archive_read_support_filter_lrzip(archive *_a)

{
  int iVar1;
  archive_read_filter_bidder *in_RAX;
  int iVar2;
  archive_read_filter_bidder *reader;
  
  reader = in_RAX;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_filter_lrzip");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    iVar1 = __archive_read_get_bidder((archive_read *)_a,&reader);
    if (iVar1 == 0) {
      reader->data = (void *)0x0;
      reader->name = "lrzip";
      reader->bid = lrzip_bidder_bid;
      reader->init = lrzip_bidder_init;
      reader->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
      reader->free = lrzip_reader_free;
      archive_set_error(_a,-1,"Using external lrzip program for lrzip decompression");
      iVar2 = -0x14;
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_filter_lrzip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *reader;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_lrzip");

	if (__archive_read_get_bidder(a, &reader) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	reader->data = NULL;
	reader->name = "lrzip";
	reader->bid = lrzip_bidder_bid;
	reader->init = lrzip_bidder_init;
	reader->options = NULL;
	reader->free = lrzip_reader_free;
	/* This filter always uses an external program. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lrzip program for lrzip decompression");
	return (ARCHIVE_WARN);
}